

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O2

void transform_reduce<tf::DynamicPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  int iVar1;
  code *pcVar2;
  double dVar3;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  long lVar4;
  Executor *this;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  int local_340;
  int smin;
  Expression_lhs<const_int_&> local_338;
  int pmin;
  ResultBuilder DOCTEST_RB;
  ulong local_2a8;
  vector<Data,_std::allocator<Data>_> vec;
  Result local_288;
  long local_268;
  Task stask;
  iterator end;
  iterator beg;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  std::vector<Data,_std::allocator<Data>_>::vector(&vec,1000,(allocator_type *)&DOCTEST_RB);
  local_2a8 = 1;
  do {
    if ((ulong)((long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= local_2a8) {
      std::_Vector_base<Data,_std::allocator<Data>_>::~_Vector_base
                (&vec.super__Vector_base<Data,_std::allocator<Data>_>);
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    lVar4 = 0;
    while (lVar4 != 0x14) {
      iVar1 = *(int *)((long)&DAT_0015aca8 + lVar4);
      smin = 0x7fffffff;
      pmin = 0x7fffffff;
      beg._M_current =
           vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      end._M_current =
           vec.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      local_268 = lVar4;
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::clear(&taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             );
      DOCTEST_RB.super_AssertData._8_8_ = &vec;
      DOCTEST_RB.super_AssertData._24_8_ = &local_2a8;
      DOCTEST_RB.super_AssertData.m_expr = (char *)&smin;
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&beg;
      DOCTEST_RB.super_AssertData.m_file = (char *)&end;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:620:37),_nullptr>
                ((FlowBuilder *)&stask,(anon_class_40_5_697928ac *)&taskflow);
      tf::FlowBuilder::
      transform_reduce<std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:632:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:633:9),_tf::DynamicPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                ((FlowBuilder *)&DOCTEST_RB.super_AssertData,&taskflow,(TestCaseData *)&beg,&end,
                 &pmin,(long)iVar1);
      tf::Node::_precede(stask._node,(Node *)DOCTEST_RB.super_AssertData.m_test_case);
      this = &executor;
      tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this,&taskflow);
      std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this);
      tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_338.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x281;
      DOCTEST_RB.super_AssertData.m_expr = "smin != std::numeric_limits<int>::max()";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_338.lhs = &smin;
      local_340 = 0x7fffffff;
      doctest::detail::Expression_lhs<int_const&>::operator!=
                (&local_288,(Expression_lhs<int_const&> *)&local_338,&local_340);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_288);
      doctest::String::~String(&local_288.m_decomp);
      dVar3 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_338.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x282;
      DOCTEST_RB.super_AssertData.m_expr = "pmin != std::numeric_limits<int>::max()";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_340 = 0x7fffffff;
      local_338.lhs = &pmin;
      DOCTEST_RB.super_AssertData.m_at = local_338.m_at;
      doctest::detail::Expression_lhs<int_const&>::operator!=
                (&local_288,(Expression_lhs<int_const&> *)&local_338,&local_340);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_288);
      doctest::String::~String(&local_288.m_decomp);
      dVar3 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      if (extraout_AL_00 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_338.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x283;
      DOCTEST_RB.super_AssertData.m_expr = "smin == pmin";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_338.lhs = &smin;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                (&local_288,&local_338,&pmin);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_288);
      doctest::String::~String(&local_288.m_decomp);
      dVar3 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if (extraout_AL_01 != '\0') {
        pcVar2 = (code *)swi(3);
        (*pcVar2)(SUB84(dVar3,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      lVar4 = local_268 + 4;
    }
    local_2a8 = local_2a8 + 1;
  } while( true );
}

Assistant:

void transform_reduce(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec(1000);

  for(size_t n=1; n<vec.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      int smin = std::numeric_limits<int>::max();
      int pmin = std::numeric_limits<int>::max();
      auto beg = vec.end();
      auto end = vec.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg = vec.begin();
        end = vec.begin() + n;
        for(auto itr = beg; itr != end; itr++) {
          smin = std::min(itr->get(), smin);
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg), std::ref(end), pmin,
        [] (int l, int r)   { return std::min(l, r); },
        [] (const Data& data) { return data.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(smin != std::numeric_limits<int>::max());
      REQUIRE(pmin != std::numeric_limits<int>::max());
      REQUIRE(smin == pmin);
    }
  }
}